

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ConcurrentAssertionMemberSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConcurrentAssertionMemberSyntax,slang::syntax::ConcurrentAssertionMemberSyntax_const&>
          (BumpAllocator *this,ConcurrentAssertionMemberSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  undefined4 uVar3;
  ConcurrentAssertionMemberSyntax *pCVar4;
  
  pCVar4 = (ConcurrentAssertionMemberSyntax *)
           ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConcurrentAssertionMemberSyntax *)this->endPtr < pCVar4 + 1) {
    pCVar4 = (ConcurrentAssertionMemberSyntax *)allocateSlow(this,0x58,8);
  }
  else {
    this->head->current = (byte *)(pCVar4 + 1);
  }
  (pCVar4->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar3 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pCVar4->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar4->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar3;
  (pCVar4->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar3 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar4->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pCVar4->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (pCVar4->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar4->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pCVar4->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005d2548;
  (pCVar4->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pCVar4->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pCVar4->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pCVar4->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005d2a10;
  (pCVar4->statement).ptr = (args->statement).ptr;
  return pCVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }